

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O1

int16_t WebRtcIsac_SetDecSampRate(ISACStruct *ISAC_main_inst,uint16_t sample_rate_hz)

{
  int16_t iVar1;
  undefined4 uVar2;
  undefined6 in_register_00000032;
  
  uVar2 = 0x10;
  if (((int)CONCAT62(in_register_00000032,sample_rate_hz) == 16000) ||
     (uVar2 = 0x20, sample_rate_hz == 32000)) {
    if ((sample_rate_hz != 16000) && (*(int *)(ISAC_main_inst + 0x538dc) == 0x10)) {
      memset(ISAC_main_inst + 0x40268,0,400);
      *(undefined8 *)(ISAC_main_inst + 0x538a0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538a8) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538b0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538b8) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538c0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538c8) = 0;
      WebRtcIsac_InitMasking((MaskFiltstr *)(ISAC_main_inst + 0x404d0));
      WebRtcIsac_InitPostFilterbank((PostFiltBankstr *)(ISAC_main_inst + 0x416b8));
    }
    *(undefined4 *)(ISAC_main_inst + 0x538dc) = uVar2;
    iVar1 = 0;
  }
  else {
    *(undefined2 *)(ISAC_main_inst + 0x538d0) = 0x17a2;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int16_t WebRtcIsac_SetDecSampRate(ISACStruct* ISAC_main_inst,
                                  uint16_t sample_rate_hz) {
  ISACMainStruct* instISAC = (ISACMainStruct*)ISAC_main_inst;
  enum IsacSamplingRate decoder_operational_rate;

  if (sample_rate_hz == 16000) {
    decoder_operational_rate = kIsacWideband;
  } else if (sample_rate_hz == 32000) {
    decoder_operational_rate = kIsacSuperWideband;
  } else {
    /* Sampling Frequency is not supported. */
    instISAC->errorCode = ISAC_UNSUPPORTED_SAMPLING_FREQUENCY;
    return -1;
  }

  if ((instISAC->decoderSamplingRateKHz == kIsacWideband) &&
        (decoder_operational_rate == kIsacSuperWideband)) {
      /* Switching from wideband to super-wideband at the decoder
       * we need to reset the filter-bank and initialize upper-band decoder. */
      memset(instISAC->synthesisFBState1, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));
      memset(instISAC->synthesisFBState2, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));

      DecoderInitUb(&instISAC->instUB);
  }
  instISAC->decoderSamplingRateKHz = decoder_operational_rate;
  return 0;
}